

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5InitVtab(int bCreate,sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVTab,
                char **pzErr)

{
  sqlite3_uint64 n;
  Fts5Config *pFVar1;
  int iVar2;
  Fts5FullTable *pFVar3;
  Fts5Index *pFVar4;
  char *pcVar5;
  Fts5Storage *__s;
  size_t sVar6;
  char *pcVar7;
  int iVar8;
  int n_00;
  long lVar9;
  int local_64;
  Fts5FullTable *local_60;
  Fts5Config *pConfig;
  int local_4c;
  Fts5Storage *local_48;
  sqlite3_vtab **local_40;
  int local_34;
  
  local_34 = 0;
  pConfig = (Fts5Config *)0x0;
  local_40 = ppVTab;
  pFVar3 = (Fts5FullTable *)sqlite3Fts5MallocZero(&local_34,0x40);
  iVar2 = local_34;
  if ((local_34 == 0) &&
     (local_60 = pFVar3, local_4c = bCreate,
     iVar2 = sqlite3Fts5ConfigParse((Fts5Global *)pAux,db,argc,argv,&pConfig,pzErr),
     pFVar1 = pConfig, pFVar3 = local_60, iVar2 == 0)) {
    (local_60->p).pConfig = pConfig;
    local_60->pGlobal = (Fts5Global *)pAux;
    local_64 = 0;
    pFVar4 = (Fts5Index *)sqlite3Fts5MallocZero(&local_64,0x88);
    (pFVar3->p).pIndex = pFVar4;
    iVar2 = local_64;
    if (local_64 == 0) {
      pFVar4->pConfig = pFVar1;
      pFVar4->nWorkUnit = 0x40;
      pcVar5 = sqlite3Fts5Mprintf(&local_64,"%s_data",pFVar1->zName);
      pFVar4->zDataTbl = pcVar5;
      iVar2 = local_64;
      if ((local_4c != 0) && (pcVar5 != (char *)0x0)) {
        iVar2 = sqlite3Fts5CreateTable(pFVar1,"data","id INTEGER PRIMARY KEY, block BLOB",0,pzErr);
        pFVar3 = local_60;
        if ((iVar2 != 0) ||
           (iVar2 = sqlite3Fts5CreateTable
                              (pFVar1,"idx","segid, term, pgno, PRIMARY KEY(segid, term)",1,pzErr),
           pFVar3 = local_60, iVar2 != 0)) goto LAB_001b24ba;
        iVar2 = sqlite3Fts5IndexReinit(pFVar4);
      }
      pFVar1 = pConfig;
      pFVar3 = local_60;
      if (iVar2 == 0) {
        pFVar4 = (local_60->p).pIndex;
        n = (long)pConfig->nCol * 8 + 0x80;
        __s = (Fts5Storage *)sqlite3_malloc64(n);
        pFVar3->pStorage = __s;
        if (__s == (Fts5Storage *)0x0) {
          iVar2 = 7;
          goto LAB_001b24ca;
        }
        memset(__s,0,n);
        __s->aTotalSize = (i64 *)(__s + 1);
        __s->pConfig = pFVar1;
        __s->pIndex = pFVar4;
        local_48 = __s;
        if (local_4c == 0) {
LAB_001b25d9:
          pFVar1 = pConfig;
          local_64 = 0;
          pcVar5 = sqlite3Fts5Mprintf(&local_64,"CREATE TABLE x(");
          for (lVar9 = 0; (pcVar5 != (char *)0x0 && (lVar9 < pFVar1->nCol)); lVar9 = lVar9 + 1) {
            pcVar7 = ", ";
            if (lVar9 == 0) {
              pcVar7 = "";
            }
            pcVar5 = sqlite3Fts5Mprintf(&local_64,"%z%s%Q",pcVar5,pcVar7,pFVar1->azCol[lVar9]);
          }
          pcVar5 = sqlite3Fts5Mprintf(&local_64,"%z, %Q HIDDEN, %s HIDDEN)",pcVar5,pFVar1->zName,
                                      "rank");
          iVar2 = local_64;
          if (pcVar5 != (char *)0x0) {
            iVar2 = sqlite3_declare_vtab(pFVar1->db,pcVar5);
            sqlite3_free(pcVar5);
          }
          pFVar1 = pConfig;
          pFVar3 = local_60;
          if (iVar2 == 0) {
            pConfig->pzErrmsg = pzErr;
            iVar2 = sqlite3Fts5IndexLoadConfig((local_60->p).pIndex);
            sqlite3Fts5IndexRollback((pFVar3->p).pIndex);
            pFVar1->pzErrmsg = (char **)0x0;
            pFVar3 = local_60;
            if (iVar2 == 0) {
              iVar2 = 0;
              goto LAB_001b24d1;
            }
          }
        }
        else {
          if (pFVar1->eContent == 0) {
            iVar2 = pFVar1->nCol;
            pcVar5 = (char *)sqlite3_malloc64((long)iVar2 * 10 + 0x20);
            if (pcVar5 == (char *)0x0) {
              iVar2 = 7;
            }
            else {
              n_00 = iVar2 * 10 + 0x20;
              sqlite3_snprintf(n_00,pcVar5,"id INTEGER PRIMARY KEY");
              sVar6 = strlen(pcVar5);
              for (iVar2 = 0; iVar2 < pFVar1->nCol; iVar2 = iVar2 + 1) {
                iVar8 = (int)sVar6;
                sqlite3_snprintf(n_00 - iVar8,pcVar5 + iVar8,", c%d");
                sVar6 = strlen(pcVar5 + iVar8);
                sVar6 = (size_t)(uint)(iVar8 + (int)sVar6);
              }
              iVar2 = sqlite3Fts5CreateTable(pFVar1,"content",pcVar5,0,pzErr);
            }
            sqlite3_free(pcVar5);
            if (iVar2 == 0) goto LAB_001b2555;
          }
          else {
LAB_001b2555:
            if ((((pFVar1->bColumnsize == 0) ||
                 (iVar2 = sqlite3Fts5CreateTable
                                    (pFVar1,"docsize","id INTEGER PRIMARY KEY, sz BLOB",0,pzErr),
                 iVar2 == 0)) &&
                (iVar2 = sqlite3Fts5CreateTable(pFVar1,"config","k PRIMARY KEY, v",1,pzErr),
                iVar2 == 0)) &&
               (iVar2 = sqlite3Fts5StorageConfigValue(local_48,"version",(sqlite3_value *)0x0,4),
               iVar2 == 0)) goto LAB_001b25d9;
          }
          sqlite3Fts5StorageClose(local_48);
          local_60->pStorage = (Fts5Storage *)0x0;
          pFVar3 = local_60;
        }
        goto LAB_001b24ca;
      }
    }
LAB_001b24ba:
    sqlite3Fts5IndexClose(pFVar4);
    (pFVar3->p).pIndex = (Fts5Index *)0x0;
  }
LAB_001b24ca:
  fts5FreeVtab(pFVar3);
  local_60 = (Fts5FullTable *)0x0;
LAB_001b24d1:
  *local_40 = (sqlite3_vtab *)local_60;
  return iVar2;
}

Assistant:

static int fts5InitVtab(
  int bCreate,                    /* True for xCreate, false for xConnect */
  sqlite3 *db,                    /* The SQLite database connection */
  void *pAux,                     /* Hash table containing tokenizers */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVTab,          /* Write the resulting vtab structure here */
  char **pzErr                    /* Write any error message here */
){
  Fts5Global *pGlobal = (Fts5Global*)pAux;
  const char **azConfig = (const char**)argv;
  int rc = SQLITE_OK;             /* Return code */
  Fts5Config *pConfig = 0;        /* Results of parsing argc/argv */
  Fts5FullTable *pTab = 0;        /* New virtual table object */

  /* Allocate the new vtab object and parse the configuration */
  pTab = (Fts5FullTable*)sqlite3Fts5MallocZero(&rc, sizeof(Fts5FullTable));
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5ConfigParse(pGlobal, db, argc, azConfig, &pConfig, pzErr);
    assert( (rc==SQLITE_OK && *pzErr==0) || pConfig==0 );
  }
  if( rc==SQLITE_OK ){
    pTab->p.pConfig = pConfig;
    pTab->pGlobal = pGlobal;
  }

  /* Open the index sub-system */
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5IndexOpen(pConfig, bCreate, &pTab->p.pIndex, pzErr);
  }

  /* Open the storage sub-system */
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5StorageOpen(
        pConfig, pTab->p.pIndex, bCreate, &pTab->pStorage, pzErr
    );
  }

  /* Call sqlite3_declare_vtab() */
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5ConfigDeclareVtab(pConfig);
  }

  /* Load the initial configuration */
  if( rc==SQLITE_OK ){
    assert( pConfig->pzErrmsg==0 );
    pConfig->pzErrmsg = pzErr;
    rc = sqlite3Fts5IndexLoadConfig(pTab->p.pIndex);
    sqlite3Fts5IndexRollback(pTab->p.pIndex);
    pConfig->pzErrmsg = 0;
  }

  if( rc!=SQLITE_OK ){
    fts5FreeVtab(pTab);
    pTab = 0;
  }else if( bCreate ){
    fts5CheckTransactionState(pTab, FTS5_BEGIN, 0);
  }
  *ppVTab = (sqlite3_vtab*)pTab;
  return rc;
}